

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O1

bool dxil_spv::emit_load_input_instruction(Impl *impl,CallInst *instruction)

{
  ulong uVar1;
  CallInst *this;
  bool bVar2;
  bool bVar3;
  Id IVar4;
  Id IVar5;
  uint uVar6;
  ValueKind VVar7;
  Builder *pBVar8;
  Operation *pOVar9;
  size_type sVar10;
  Value *pVVar11;
  Value *this_00;
  Constant *this_01;
  APInt *this_02;
  uint64_t uVar12;
  LoggingCallback p_Var13;
  void *pvVar14;
  ulong uVar15;
  _Hash_node_base *p_Var16;
  byte bVar17;
  mapped_type *pmVar18;
  __node_base_ptr p_Var19;
  __node_base_ptr p_Var20;
  Op OVar21;
  uint32_t input_element_index;
  BuiltIn builtin_1;
  BuiltIn builtin;
  uint local_1064;
  CallInst *local_1060;
  undefined4 local_1058;
  Id local_1054;
  mapped_type *local_1050;
  uint local_1048;
  BuiltIn local_1044;
  Id local_1040;
  Id local_103c;
  initializer_list<unsigned_int> local_1038;
  undefined5 uStack_1028;
  char acStack_1023 [4083];
  
  pBVar8 = Converter::Impl::builder(impl);
  bVar2 = get_constant_operand(&instruction->super_Instruction,1,&local_1064);
  if (!bVar2) {
    return bVar2;
  }
  uVar1 = (impl->input_clip_cull_meta)._M_h._M_bucket_count;
  uVar15 = (ulong)local_1064 % uVar1;
  p_Var19 = (impl->input_clip_cull_meta)._M_h._M_buckets[uVar15];
  p_Var20 = (__node_base_ptr)0x0;
  if ((p_Var19 != (__node_base_ptr)0x0) &&
     (p_Var16 = p_Var19->_M_nxt, p_Var20 = p_Var19,
     *(uint *)&p_Var19->_M_nxt[1]._M_nxt != local_1064)) {
    while (p_Var19 = p_Var16, p_Var16 = p_Var19->_M_nxt, p_Var16 != (_Hash_node_base *)0x0) {
      p_Var20 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var16[1]._M_nxt % uVar1 != uVar15) ||
         (p_Var20 = p_Var19, *(uint *)&p_Var16[1]._M_nxt == local_1064)) goto LAB_0015fb1a;
    }
    p_Var20 = (__node_base_ptr)0x0;
  }
LAB_0015fb1a:
  if (p_Var20 == (__node_base_ptr)0x0) {
    p_Var16 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var16 = p_Var20->_M_nxt;
  }
  if (p_Var16 != (_Hash_node_base *)0x0) {
    IVar4 = get_clip_cull_distance_access_chain
                      (impl,instruction,(ClipCullMeta *)((long)&p_Var16[1]._M_nxt + 4),
                       StorageClassInput);
    pOVar9 = Converter::Impl::allocate(impl,OpLoad,(Value *)instruction);
    Operation::add_id(pOVar9,IVar4);
    Converter::Impl::add(impl,pOVar9,false);
    return bVar2;
  }
  local_1050 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&impl->input_elements_meta,&local_1064);
  IVar4 = local_1050->id;
  IVar5 = spv::Builder::getDerefTypeId(pBVar8,IVar4);
  if ((impl->execution_model - ExecutionModelTessellationControl < 3) ||
     (sVar10 = std::
               _Hashtable<unsigned_int,_unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count(&(impl->llvm_attribute_at_vertex_indices)._M_h,&local_1064), sVar10 != 0)) {
    IVar5 = spv::Builder::getContainedTypeId(pBVar8,IVar5);
    local_1058 = (undefined4)CONCAT71((uint7)(uint3)(IVar5 >> 8),1);
  }
  else {
    local_1058 = 0;
  }
  OVar21 = (pBVar8->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_start[IVar5]->opCode & ~OpUndef;
  local_1060 = instruction;
  if (OVar21 == OpTypeArray) {
    IVar5 = spv::Builder::getContainedTypeId(pBVar8,IVar5);
  }
  uVar6 = spv::Builder::getNumTypeConstituents(pBVar8,IVar5);
  bVar17 = (byte)local_1058;
  local_1054 = IVar4;
  if ((byte)(1 < uVar6 | bVar17 | OVar21 == OpTypeArray) == 1) {
    local_1048 = uVar6;
    IVar5 = Converter::Impl::get_effective_input_output_type_id(impl,local_1050->component_type);
    IVar5 = spv::Builder::makePointer(pBVar8,StorageClassInput,IVar5);
    pOVar9 = Converter::Impl::allocate(impl,OpAccessChain,IVar5);
    local_1054 = pOVar9->id;
    Operation::add_id(pOVar9,IVar4);
    if (bVar17 != 0) {
      pVVar11 = LLVMBC::Instruction::getOperand(&local_1060->super_Instruction,4);
      this_00 = LLVMBC::Internal::resolve_proxy(pVVar11);
      VVar7 = LLVMBC::Value::get_value_kind(this_00);
      if (VVar7 == Undef) {
        IVar5 = spv::Builder::makeIntegerType(pBVar8,0x20,false);
        IVar5 = spv::Builder::makeIntConstant(pBVar8,IVar5,0,false);
      }
      else {
        IVar5 = Converter::Impl::get_id_for_value(impl,pVVar11,0);
      }
      Operation::add_id(pOVar9,IVar5);
    }
    if (OVar21 == OpTypeArray) {
      pVVar11 = LLVMBC::Instruction::getOperand(&local_1060->super_Instruction,2);
      IVar5 = Converter::Impl::get_id_for_value(impl,pVVar11,0);
      Operation::add_id(pOVar9,IVar5);
    }
    if (1 < local_1048) {
      pVVar11 = LLVMBC::Instruction::getOperand(&local_1060->super_Instruction,3);
      IVar5 = Converter::Impl::get_id_for_value(impl,pVVar11,0x20);
      Operation::add_id(pOVar9,IVar5);
    }
    Converter::Impl::add(impl,pOVar9,false);
  }
  pmVar18 = local_1050;
  this = local_1060;
  bVar3 = SPIRVModule::query_builtin_shader_input
                    (impl->spirv_module,local_1050->id,(BuiltIn *)&local_1038);
  if ((bVar3) && ((int)local_1038._M_array == 0x11)) {
    pBVar8 = Converter::Impl::builder(impl);
    IVar5 = spv::Builder::makeBoolType(pBVar8);
  }
  else {
    IVar5 = Converter::Impl::get_effective_input_output_type_id(impl,pmVar18->component_type);
  }
  pOVar9 = Converter::Impl::allocate(impl,OpLoad,(Value *)this,IVar5);
  Operation::add_id(pOVar9,local_1054);
  Converter::Impl::add(impl,pOVar9,false);
  pBVar8 = Converter::Impl::builder(impl);
  bVar3 = SPIRVModule::query_builtin_shader_input(impl->spirv_module,IVar4,&local_1044);
  if (bVar3) {
    if ((local_1044 & ~BuiltInPointSize) == BuiltInVertexIndex) {
      IVar4 = SPIRVModule::get_builtin_shader_input
                        (impl->spirv_module,local_1044 == BuiltInInstanceIndex | BuiltInBaseVertex);
      IVar5 = spv::Builder::makeIntegerType(pBVar8,0x20,false);
      pOVar9 = Converter::Impl::allocate(impl,OpLoad,IVar5);
      Operation::add_id(pOVar9,IVar4);
      IVar4 = pOVar9->id;
      Converter::Impl::add(impl,pOVar9,false);
      IVar5 = spv::Builder::makeIntegerType(pBVar8,0x20,false);
      pOVar9 = Converter::Impl::allocate(impl,OpISub,IVar5);
      local_1040 = Converter::Impl::get_id_for_value(impl,(Value *)this,0);
      local_1038._M_array = &local_1040;
      local_1038._M_len._0_5_ = 2;
      local_1038._M_len._5_3_ = 0;
      local_103c = IVar4;
      Operation::add_ids(pOVar9,&local_1038);
      Converter::Impl::add(impl,pOVar9,false);
      Converter::Impl::rewrite_value(impl,(Value *)this,pOVar9->id);
      pmVar18 = local_1050;
      local_1038._M_array = (iterator)CONCAT44(local_1038._M_array._4_4_,0x114b);
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&pBVar8->capabilities,(Capability *)&local_1038);
    }
    else {
      if (local_1044 == BuiltInFragCoord) {
        pVVar11 = LLVMBC::Instruction::getOperand(&this->super_Instruction,3);
        this_01 = (Constant *)LLVMBC::Internal::resolve_proxy(pVVar11);
        VVar7 = LLVMBC::Value::get_value_kind((Value *)this_01);
        if (VVar7 != ConstantInt) {
          p_Var13 = get_thread_log_callback();
          if (p_Var13 == (LoggingCallback)0x0) {
            emit_load_input_instruction();
            std::terminate();
          }
          uStack_1028 = 0x6163206e69;
          builtin_strncpy(acStack_1023,"st<T>.\n",8);
          local_1038._M_array = (iterator)0x2064696c61766e49;
          local_1038._M_len._0_5_ = 0x2065707974;
          local_1038._M_len._5_3_ = 0x204449;
          pvVar14 = get_thread_log_callback_userdata();
          (*p_Var13)(pvVar14,Error,(char *)&local_1038);
          std::terminate();
        }
        this_02 = LLVMBC::Constant::getUniqueInteger(this_01);
        uVar12 = LLVMBC::APInt::getZExtValue(this_02);
        if (uVar12 != 3) goto LAB_00160033;
        IVar4 = spv::Builder::makeFloatType(pBVar8,0x20);
        pOVar9 = Converter::Impl::allocate(impl,OpFDiv,IVar4);
        IVar4 = spv::Builder::makeFloatConstant(pBVar8,1.0,false);
        Operation::add_id(pOVar9,IVar4);
        IVar4 = Converter::Impl::get_id_for_value(impl,(Value *)this,0);
      }
      else {
        if (local_1044 != BuiltInFrontFacing) goto LAB_00160033;
        IVar4 = spv::Builder::makeIntegerType(pBVar8,0x20,false);
        pOVar9 = Converter::Impl::allocate(impl,OpSelect,IVar4);
        IVar4 = Converter::Impl::get_id_for_value(impl,(Value *)this,0);
        Operation::add_id(pOVar9,IVar4);
        IVar4 = spv::Builder::makeIntegerType(pBVar8,0x20,false);
        IVar4 = spv::Builder::makeIntConstant(pBVar8,IVar4,0xffffffff,false);
        Operation::add_id(pOVar9,IVar4);
        IVar4 = spv::Builder::makeIntegerType(pBVar8,0x20,false);
        IVar4 = spv::Builder::makeIntConstant(pBVar8,IVar4,0,false);
      }
      Operation::add_id(pOVar9,IVar4);
      Converter::Impl::add(impl,pOVar9,false);
      Converter::Impl::rewrite_value(impl,(Value *)this,pOVar9->id);
    }
  }
LAB_00160033:
  Converter::Impl::fixup_load_type_io(impl,pmVar18->component_type,1,(Value *)this);
  return bVar2;
}

Assistant:

bool emit_load_input_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	uint32_t input_element_index;
	if (!get_constant_operand(instruction, 1, &input_element_index))
		return false;

	// Need special handling for clip distance.
	auto *clip_cull_meta = input_clip_cull_distance_meta(impl, input_element_index);
	if (clip_cull_meta)
		return emit_load_clip_cull_distance(impl, instruction, *clip_cull_meta);

	const auto &meta = impl.input_elements_meta[input_element_index];
	uint32_t var_id = meta.id;
	uint32_t ptr_id;

	spv::Id input_type_id = builder.getDerefTypeId(var_id);

	bool array_index = false;
	if (impl.execution_model == spv::ExecutionModelTessellationControl ||
	    impl.execution_model == spv::ExecutionModelGeometry ||
	    impl.execution_model == spv::ExecutionModelTessellationEvaluation ||
	    impl.llvm_attribute_at_vertex_indices.count(input_element_index) != 0)
	{
		input_type_id = builder.getContainedTypeId(input_type_id);
		array_index = true;
	}

	bool row_index = false;
	if (builder.isArrayType(input_type_id))
	{
		row_index = true;
		input_type_id = builder.getContainedTypeId(input_type_id);
	}

	uint32_t num_cols = builder.getNumTypeComponents(input_type_id);

	if (num_cols > 1 || row_index || array_index)
	{
		// Need to deal with signed vs unsigned here.
		Operation *op =
			impl.allocate(spv::OpAccessChain,
			              builder.makePointer(spv::StorageClassInput,
			                                  impl.get_effective_input_output_type_id(meta.component_type)));
		ptr_id = op->id;

		op->add_id(var_id);
		// Vertex array index for GS/DS/HS or barycentrics.
		if (array_index)
		{
			auto *index = instruction->getOperand(4);
			if (llvm::isa<llvm::UndefValue>(index))
			{
				// If we loadInput on a barycentric input, we get nointerpolation,
				// i.e. flat, i.e. provoking vertex, i.e. vertex 0.
				op->add_id(builder.makeUintConstant(0));
			}
			else
				op->add_id(impl.get_id_for_value(index));
		}
		if (row_index)
			op->add_id(impl.get_id_for_value(instruction->getOperand(2)));
		if (num_cols > 1)
			op->add_id(impl.get_id_for_value(instruction->getOperand(3), 32));

		impl.add(op);
	}
	else
		ptr_id = var_id;

	// Need to deal with signed vs unsigned here.
	spv::Id load_type = get_builtin_load_type(impl, meta);

	Operation *op = impl.allocate(spv::OpLoad, instruction, load_type);
	op->add_id(ptr_id);
	impl.add(op);

	fixup_builtin_load(impl, var_id, instruction);

	// Need to bitcast after we load.
	impl.fixup_load_type_io(meta.component_type, 1, instruction);
	return true;
}